

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xgemm.c
# Opt level: O3

void xb_sgemm(char *transa,char *transb,int *M,int *N,int *K,float *alpha,float *a,int *p_lda,
             float *b,int *p_ldb,float *beta,float *c,int *p_ldc)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  float *pfVar7;
  float *pfVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  float *pfVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  float fVar19;
  float fVar20;
  
  uVar6 = *M;
  uVar2 = *N;
  uVar3 = *K;
  if ((int)uVar6 <= *p_ldc && (0 < (int)uVar3 && (0 < (int)uVar2 && 0 < (int)uVar6))) {
    fVar19 = *alpha;
    fVar1 = *beta;
    uVar14 = (ulong)uVar6;
    uVar9 = *p_lda;
    uVar4 = *p_ldb;
    uVar5 = uVar3;
    if ((byte)(*transa | 0x20U) == 0x6e) {
      uVar5 = uVar6;
    }
    if ((int)uVar5 <= (int)uVar9) {
      uVar6 = uVar2;
      if ((byte)(*transb | 0x20U) == 0x6e) {
        uVar6 = uVar3;
      }
      if (((int)uVar6 <= (int)uVar4) &&
         ((((fVar19 != 0.0 || (NAN(fVar19))) || (fVar1 != 1.0)) || (NAN(fVar1))))) {
        if ((byte)(*transa | 0x20U) == 0x6e) {
          uVar10 = 1;
          uVar11 = (ulong)uVar9;
        }
        else {
          uVar11 = 1;
          uVar10 = (ulong)uVar9;
        }
        uVar13 = 1;
        uVar17 = (ulong)uVar4;
        if ((byte)(*transb | 0x20U) != 0x6e) {
          uVar17 = 1;
          uVar13 = (ulong)uVar4;
        }
        lVar12 = (long)*p_ldc;
        if ((fVar19 != 0.0) || (NAN(fVar19))) {
          if ((fVar19 != 1.0) || (NAN(fVar19))) {
            uVar18 = 0;
            do {
              uVar6 = 0;
              pfVar7 = b;
              uVar16 = uVar18;
              do {
                fVar20 = 0.0;
                pfVar8 = pfVar7;
                pfVar15 = a;
                uVar9 = uVar3;
                do {
                  fVar20 = fVar20 + *pfVar15 * *pfVar8;
                  pfVar8 = pfVar8 + uVar13;
                  pfVar15 = pfVar15 + uVar11;
                  uVar9 = uVar9 - 1;
                } while (uVar9 != 0);
                c[uVar16] = c[uVar16] * fVar1 + fVar20 * fVar19;
                uVar6 = uVar6 + 1;
                uVar16 = uVar16 + lVar12;
                pfVar7 = pfVar7 + uVar17;
              } while (uVar6 != uVar2);
              uVar18 = uVar18 + 1;
              a = a + uVar10;
            } while (uVar18 != uVar14);
          }
          else if ((fVar1 != 0.0) || (NAN(fVar1))) {
            uVar18 = 0;
            do {
              uVar6 = 0;
              pfVar7 = b;
              uVar16 = uVar18;
              do {
                fVar19 = 0.0;
                pfVar8 = pfVar7;
                pfVar15 = a;
                uVar9 = uVar3;
                do {
                  fVar19 = fVar19 + *pfVar15 * *pfVar8;
                  pfVar8 = pfVar8 + uVar13;
                  pfVar15 = pfVar15 + uVar11;
                  uVar9 = uVar9 - 1;
                } while (uVar9 != 0);
                c[uVar16] = fVar19 + c[uVar16] * fVar1;
                uVar6 = uVar6 + 1;
                uVar16 = uVar16 + lVar12;
                pfVar7 = pfVar7 + uVar17;
              } while (uVar6 != uVar2);
              uVar18 = uVar18 + 1;
              a = a + uVar10;
            } while (uVar18 != uVar14);
          }
          else {
            uVar18 = 0;
            do {
              uVar6 = 0;
              pfVar7 = b;
              uVar16 = uVar18;
              do {
                fVar19 = 0.0;
                pfVar8 = a;
                pfVar15 = pfVar7;
                uVar9 = uVar3;
                do {
                  fVar19 = fVar19 + *pfVar8 * *pfVar15;
                  pfVar15 = pfVar15 + uVar13;
                  pfVar8 = pfVar8 + uVar11;
                  uVar9 = uVar9 - 1;
                } while (uVar9 != 0);
                c[uVar16] = fVar19;
                uVar6 = uVar6 + 1;
                uVar16 = uVar16 + lVar12;
                pfVar7 = pfVar7 + uVar17;
              } while (uVar6 != uVar2);
              uVar18 = uVar18 + 1;
              a = a + uVar10;
            } while (uVar18 != uVar14);
          }
        }
        else {
          uVar10 = 0;
          uVar6 = uVar2;
          pfVar7 = c;
          do {
            do {
              *c = *c * fVar1;
              c = c + lVar12;
              uVar6 = uVar6 - 1;
            } while (uVar6 != 0);
            uVar10 = uVar10 + 1;
            c = pfVar7 + 1;
            uVar6 = uVar2;
            pfVar7 = c;
          } while (uVar10 != uVar14);
        }
      }
    }
  }
  return;
}

Assistant:

void
xb_sgemm (char *transa, char *transb, int *M, int *N, int *K,
	  float *alpha, const float *a, int *p_lda, const float *b, 
	  int *p_ldb, float *beta, float *c, int *p_ldc)
/* 
 * Purpose
 * =======
 *
 * This routine computes the matrix product:
 *
 *      C   <-  alpha * op(A) * op(B)  +  beta * C .
 * 
 * where op(M) represents either M, M transpose, 
 * or M conjugate transpose.
 *
 * Arguments
 * =========
 *
 * order   (input) enum blas_order_type
 *         Storage  of input matrices A, B, and C.
 *
 * transa  (input) enum blas_trans_type
 *         Operation to be done on matrix A before multiplication.
 *         Can be no operation, transposition, or conjugate transposition.
 *
 * transb  (input) enum blas_trans_type
 *         Operation to be done on matrix B before multiplication.
 *         Can be no operation, transposition, or conjugate transposition.
 * 
 * m n k   (input) int
 *         The dimensions of matrices A, B, and C.
 *         Matrix C is m-by-n matrix.
 *         Matrix A is m-by-k if A is not transposed, 
 *                     k-by-m otherwise.
 *         Matrix B is k-by-n if B is not transposed, 
 *                     n-by-k otherwise.
 *      
 * alpha   (input) float
 *
 * a       (input) const float*
 *         matrix A.
 * 
 * lda     (input) int
 *         leading dimension of A.
 * 
 * b       (input) const float*
 *         matrix B
 *
 * ldb     (input) int
 *         leading dimension of B.
 *
 * beta    (input) float
 *
 * c       (input/output) float*
 *         matrix C
 *
 * ldc     (input) int
 *         leading dimension of C.
 *
 */
{


    /* Integer Index Variables */
    int i, j, h;

    int ai, bj, ci;
    int aih, bhj, cij;		/* Index into matrices a, b, c during multiply */

    int incai, incaih;		/* Index increments for matrix a */
    int incbj, incbhj;		/* Index increments for matrix b */
    int incci, inccij;		/* Index increments for matrix c */

    /* Input Matrices */
    const float *a_i = a;
    const float *b_i = b;

    /* Output Matrix */
    float *c_i = c;

    /* Input Scalars */
    float alpha_i = *alpha;
    float beta_i = *beta;
    int m=*M, n=*N, k=*K;
    int lda=*p_lda, ldb=*p_ldb, ldc=*p_ldc;

    /* Temporary Floating-Point Variables */
    float a_elem;
    float b_elem;
    float c_elem;
    float prod;
    float sum;
    float tmp1;
    float tmp2;

    char order = COLMAJOR; /* For the time being, it is always COLMAJOR.
			      Eventually, it might change. */

#if MDEBUG
    const float *A = a, *B =b, *C = c, *C1 = c;
    printf("In Sgemm\n");
    printf("m=%d, n=%d, k=%d\n", m, n, k);
    printf("alpha=%f, beta=%f\n", alpha_i, beta_i);
    printf("\n");	  
    /* for(i=0; i<m*k; i++)  printf("%.1f ", *A++); printf("\n\n"); */
    /* for(i=0; i<n*k; i++)  printf("%.1f ", *B++); printf("\n\n"); */
    /* for(i=0; i<n*k; i++)  printf("%.1f ", *C++); printf("\n"); */
#endif
    
    /* Test for error conditions */
    if (m <= 0 || n <= 0 || k <= 0)
    {
	return;
    }

    if (order == COLMAJOR)
    {

	if (ldc < m)
	    return;

	if (*transa == 'n' || *transa == 'N')
	{
	    if (lda < m)
		return;
	}
	else
	{
	    if (lda < k)
		return;
	}

	if (*transb == 'n' || *transb == 'N')
	{
	    if (ldb < k)
		return;
	}
	else
	{
	    if (ldb < n)
		return;
	}

    }
    else
    {
	/* row major */
	if (ldc < n)
	    return;

	if (*transa == 'n' || *transa == 'N')
	{
	    if (lda < k)
		return;
	}
	else
	{
	    if (lda < m)
		return;
	}

	if (*transb == 'n' || *transb == 'N')
	{
	    if (ldb < n)
		return;
	}
	else
	{
	    if (ldb < k)
		return;
	}
    }

    /* Test for no-op */
    if (alpha_i == 0.0 && beta_i == 1.0)
    {
	return;
    }

    /* Set Index Parameters */
    if (order == COLMAJOR)
    {
	incci = 1;
	inccij = ldc;

	if (*transa == 'n' || *transa == 'N')
	{
	    incai = 1;
	    incaih = lda;
	}
	else
	{
	    incai = lda;
	    incaih = 1;
	}

	if (*transb == 'n' || *transb == 'N')
	{
	    incbj = ldb;
	    incbhj = 1;
	}
	else
	{
	    incbj = 1;
	    incbhj = ldb;
	}

    }
    else
    {
	/* row major */
	incci = ldc;
	inccij = 1;

	if (*transa == 'n' || *transa == 'N')
	{
	    incai = lda;
	    incaih = 1;
	}
	else
	{
	    incai = 1;
	    incaih = lda;
	}

	if (*transb == 'n' || *transb == 'N')
	{
	    incbj = 1;
	    incbhj = ldb;
	}
	else
	{
	    incbj = ldb;
	    incbhj = 1;
	}

    }



    /* Ajustment to increments */







    /* alpha = 0.  In this case, just return beta * C */
    if (alpha_i == 0.0)
    {

	ci = 0;
	for (i = 0; i < m; i++, ci += incci)
	{
	    cij = ci;
	    for (j = 0; j < n; j++, cij += inccij)
	    {
		c_elem = c_i[cij];
		tmp1 = c_elem * beta_i;
		c_i[cij] = tmp1;
	    }
	}

    }
    else if (alpha_i == 1.0)
    {

	/* Case alpha == 1. */

	if (beta_i == 0.0)
	{
	    /* Case alpha == 1, beta == 0.   We compute  C <--- A * B */

	    ci = 0;
	    ai = 0;
	    for (i = 0; i < m; i++, ci += incci, ai += incai)
	    {

		cij = ci;
		bj = 0;

		for (j = 0; j < n; j++, cij += inccij, bj += incbj)
		{

		    aih = ai;
		    bhj = bj;

		    sum = 0.0;

		    for (h = 0; h < k; h++, aih += incaih, bhj += incbhj)
		    {
			a_elem = a_i[aih];
			b_elem = b_i[bhj];
			prod = a_elem * b_elem;
			sum = sum + prod;
		    }
		    tmp1 = sum;
		    c_i[cij] = tmp1;
		}
	    }

	}
	else
	{
	    /* Case alpha == 1, but beta != 0.
	       We compute   C <--- A * B + beta * C   */

	    ci = 0;
	    ai = 0;
	    for (i = 0; i < m; i++, ci += incci, ai += incai)
	    {

		cij = ci;
		bj = 0;

		for (j = 0; j < n; j++, cij += inccij, bj += incbj)
		{

		    aih = ai;
		    bhj = bj;

		    sum = 0.0;

		    for (h = 0; h < k; h++, aih += incaih, bhj += incbhj)
		    {
			a_elem = a_i[aih];
			b_elem = b_i[bhj];
			prod = a_elem * b_elem;
			sum = sum + prod;
		    }

		    c_elem = c_i[cij];
		    tmp2 = c_elem * beta_i;
		    tmp1 = sum;
		    tmp1 = tmp2 + tmp1;
		    c_i[cij] = tmp1;
		}
	    }
	}

    }
    else
    {

	/* The most general form,   C <-- alpha * A * B + beta * C  */
	ci = 0;
	ai = 0;
	for (i = 0; i < m; i++, ci += incci, ai += incai)
	{

	    cij = ci;
	    bj = 0;

	    for (j = 0; j < n; j++, cij += inccij, bj += incbj)
	    {

		aih = ai;
		bhj = bj;

		sum = 0.0;

		for (h = 0; h < k; h++, aih += incaih, bhj += incbhj)
		{
		    a_elem = a_i[aih];
		    b_elem = b_i[bhj];
		    prod = a_elem * b_elem;
		    sum = sum + prod;
		}

		tmp1 = sum * alpha_i;
		c_elem = c_i[cij];
		tmp2 = c_elem * beta_i;
		tmp1 = tmp1 + tmp2;
		c_i[cij] = tmp1;
	    }
	}

    }

#if MDEBUG
    printf("m=%d, n=%d, k=%d\n", m, n, k);
    printf("lda=%d, ldb=%d, ldc=%d\n", lda, ldb, ldc);
    printf("\n");	  
    for(i=0; i<n*k; i++)  printf("%.1f ", *C1++); printf("\n");
#endif

}